

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lptree.c
# Opt level: O0

int checkloops(TTree *tree)

{
  int iVar1;
  TTree *local_18;
  TTree *tree_local;
  
  local_18 = tree;
  while( true ) {
    while( true ) {
      if ((local_18->tag == '\x05') && (iVar1 = checkaux(local_18 + 1,0), iVar1 != 0)) {
        return 1;
      }
      if (local_18->tag == '\r') {
        return 0;
      }
      if (""[local_18->tag] != '\x01') break;
      local_18 = local_18 + 1;
    }
    if (""[local_18->tag] != '\x02') {
      return 0;
    }
    iVar1 = checkloops(local_18 + 1);
    if (iVar1 != 0) break;
    local_18 = local_18 + (local_18->u).ps;
  }
  return 1;
}

Assistant:

static int checkloops (TTree *tree) {
 tailcall:
  if (tree->tag == TRep && nullable(sib1(tree)))
    return 1;
  else if (tree->tag == TGrammar)
    return 0;  /* sub-grammars already checked */
  else {
    switch (numsiblings[tree->tag]) {
      case 1:  /* return checkloops(sib1(tree)); */
        tree = sib1(tree); goto tailcall;
      case 2:
        if (checkloops(sib1(tree))) return 1;
        /* else return checkloops(sib2(tree)); */
        tree = sib2(tree); goto tailcall;
      default: assert(numsiblings[tree->tag] == 0); return 0;
    }
  }
}